

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddNestedExtensions
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *filename,
          DescriptorProto *message_type,FileDescriptorProto *value)

{
  bool bVar1;
  Type *message_type_00;
  Type *field;
  int iVar2;
  
  if (0 < (message_type->nested_type_).super_RepeatedPtrFieldBase.current_size_) {
    iVar2 = 0;
    do {
      message_type_00 =
           internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                     (&(message_type->nested_type_).super_RepeatedPtrFieldBase,iVar2);
      bVar1 = AddNestedExtensions(this,filename,message_type_00,value);
      if (!bVar1) {
        return false;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < (message_type->nested_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((message_type->extension_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    bVar1 = true;
  }
  else {
    iVar2 = 0;
    do {
      field = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                        (&(message_type->extension_).super_RepeatedPtrFieldBase,iVar2);
      bVar1 = AddExtension(this,filename,field,value);
      if (!bVar1) {
        return bVar1;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < (message_type->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  return bVar1;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddNestedExtensions(
    const std::string& filename, const DescriptorProto& message_type,
    Value value) {
  for (int i = 0; i < message_type.nested_type_size(); i++) {
    if (!AddNestedExtensions(filename, message_type.nested_type(i), value))
      return false;
  }
  for (int i = 0; i < message_type.extension_size(); i++) {
    if (!AddExtension(filename, message_type.extension(i), value)) return false;
  }
  return true;
}